

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_generated_code.cc
# Opt level: O3

void __thiscall GeneratedCode_UTF8_Test::TestBody(GeneratedCode_UTF8_Test *this)

{
  upb_DecodeStatus uVar1;
  upb_Arena *a;
  upb_Message *msg;
  anon_union_8_2_9eb4e620_for_upb_Message_0 *msg_00;
  char *pcVar2;
  char invalid_utf8 [2];
  char *ptr;
  upb_StringView serialized;
  undefined2 local_62;
  AssertHelper local_60;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_58;
  internal local_50;
  undefined7 uStack_4f;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_48 [2];
  size_t local_38;
  
  local_62 = 0xff;
  a = upb_Arena_Init((void *)0x0,0,&upb_alloc_global);
  msg = (upb_Message *)a->ptr_dont_copy_me__upb_internal_use_only;
  if ((ulong)((long)a->end_dont_copy_me__upb_internal_use_only - (long)msg) < 0x430) {
    msg = (upb_Message *)_upb_Arena_SlowMalloc_dont_copy_me__upb_internal_use_only(a,0x430);
  }
  else {
    if ((upb_Message *)((ulong)((long)&msg->field_0 + 7U) & 0xfffffffffffffff8) != msg)
    goto LAB_001a96d5;
    a->ptr_dont_copy_me__upb_internal_use_only = (char *)(msg + 0x86);
  }
  if (msg != (upb_Message *)0x0) {
    memset(msg,0,0x430);
  }
  if (((ulong)msg->field_0 & 1) != 0) {
    __assert_fail("!upb_Message_IsFrozen(msg)",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/message/internal/accessors.h"
                  ,0x13b,
                  "void upb_Message_SetBaseField(struct upb_Message *, const upb_MiniTableField *, const void *)"
                 );
  }
  msg[0x10].field_0 = (anon_union_8_2_9eb4e620_for_upb_Message_0)&local_62;
  msg[0x11].field_0 = (anon_union_8_2_9eb4e620_for_upb_Message_0)0x1;
  upb_Encode(msg,&protobuf_0test_0messages__proto3__TestAllTypesProto3_msg_init,0,a,
             (char **)&local_50,&local_38);
  pcVar2 = (char *)CONCAT71(uStack_4f,local_50);
  msg_00 = (anon_union_8_2_9eb4e620_for_upb_Message_0 *)a->ptr_dont_copy_me__upb_internal_use_only;
  if ((ulong)((long)a->end_dont_copy_me__upb_internal_use_only - (long)msg_00) < 0x430) {
    msg_00 = (anon_union_8_2_9eb4e620_for_upb_Message_0 *)
             _upb_Arena_SlowMalloc_dont_copy_me__upb_internal_use_only(a,0x430);
  }
  else {
    if ((anon_union_8_2_9eb4e620_for_upb_Message_0 *)
        ((ulong)((long)msg_00 + 7U) & 0xfffffffffffffff8) != msg_00) {
LAB_001a96d5:
      __assert_fail("((((uintptr_t)ret) + (8) - 1) / (8) * (8)) == (uintptr_t)ret",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/mem/internal/arena.h"
                    ,0x3b,"void *upb_Arena_Malloc(struct upb_Arena *, size_t)");
    }
    a->ptr_dont_copy_me__upb_internal_use_only = (char *)(msg_00 + 0x86);
  }
  if (msg_00 == (anon_union_8_2_9eb4e620_for_upb_Message_0 *)0x0) {
    local_58._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  }
  else {
    memset(msg_00,0,0x430);
    uVar1 = upb_Decode(pcVar2,local_38,(upb_Message *)msg_00,
                       &protobuf_0test_0messages__proto3__TestAllTypesProto3_msg_init,
                       (upb_ExtensionRegistry *)0x0,0,a);
    local_58._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)msg_00;
    if (uVar1 != kUpb_DecodeStatus_Ok) {
      local_58._M_head_impl =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           (anon_union_8_2_9eb4e620_for_upb_Message_0 *)0x0;
    }
  }
  local_60.data_ = (AssertHelperData *)0x0;
  testing::internal::
  CmpHelperEQ<protobuf_test_messages_proto3_TestAllTypesProto3*,protobuf_test_messages_proto3_TestAllTypesProto3*>
            (&local_50,"nullptr","msg2",
             (protobuf_test_messages_proto3_TestAllTypesProto3 **)&local_60,
             (protobuf_test_messages_proto3_TestAllTypesProto3 **)&local_58);
  if (local_50 == (internal)0x0) {
    testing::Message::Message((Message *)&local_58);
    if (local_48[0] == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = (local_48[0]->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_60,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/test/test_generated_code.cc"
               ,0x1ef,pcVar2);
    testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_58);
    testing::internal::AssertHelper::~AssertHelper(&local_60);
    if ((anon_union_8_2_9eb4e620_for_upb_Message_0 *)local_58._M_head_impl !=
        (anon_union_8_2_9eb4e620_for_upb_Message_0 *)0x0) {
      (**(code **)(*(anon_union_8_2_9eb4e620_for_upb_Message_0 *)local_58._M_head_impl + 8))();
    }
  }
  if (local_48[0] != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_48,local_48[0]);
  }
  upb_Arena_Free(a);
  return;
}

Assistant:

TEST(GeneratedCode, UTF8) {
  const char invalid_utf8[] = "\xff";
  const upb_StringView invalid_utf8_view =
      upb_StringView_FromDataAndSize(invalid_utf8, 1);
  upb_Arena* arena = upb_Arena_New();
  upb_StringView serialized;
  protobuf_test_messages_proto3_TestAllTypesProto3* msg =
      protobuf_test_messages_proto3_TestAllTypesProto3_new(arena);
  protobuf_test_messages_proto3_TestAllTypesProto3* msg2;

  protobuf_test_messages_proto3_TestAllTypesProto3_set_optional_string(
      msg, invalid_utf8_view);

  serialized.data = protobuf_test_messages_proto3_TestAllTypesProto3_serialize(
      msg, arena, &serialized.size);

  msg2 = protobuf_test_messages_proto3_TestAllTypesProto3_parse(
      serialized.data, serialized.size, arena);
  EXPECT_EQ(nullptr, msg2);

  upb_Arena_Free(arena);
}